

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O3

double __thiscall Json::Value::asDouble(Value *this)

{
  double dVar1;
  OStringStream oss;
  String local_1a0;
  ostringstream local_180 [376];
  
  switch(*(undefined1 *)&this->bits_) {
  case 1:
    dVar1 = (double)(this->value_).int_;
    break;
  case 2:
    dVar1 = (double)((this->value_).uint_ >> 1);
    dVar1 = dVar1 + dVar1 + (double)((uint)(this->value_).uint_ & 1);
    break;
  case 3:
    dVar1 = (double)(this->value_).int_;
    break;
  default:
    std::__cxx11::ostringstream::ostringstream(local_180);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_180,"Value is not convertible to double.",0x23);
    std::__cxx11::stringbuf::str();
    throwLogicError(&local_1a0);
  case 5:
    if ((this->value_).bool_ != false) {
      return 1.0;
    }
  case 0:
    dVar1 = 0.0;
  }
  return dVar1;
}

Assistant:

ValueType Value::type() const {
  return static_cast<ValueType>(bits_.value_type_);
}